

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.hpp
# Opt level: O0

PointType __thiscall Bezier<3,_2>::at(Bezier<3,_2> *this,double *t,int *derivative_order)

{
  int iVar1;
  double *pdVar2;
  double in_RCX;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar3;
  double in_XMM1_Qa;
  PointType PVar4;
  ColXpr local_310;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>_>
  local_2e0;
  ColXpr local_290;
  ColXpr local_260;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>_>
  local_230;
  ColXpr local_1e0;
  double local_1b0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>_>
  local_1a8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>_>_>
  local_158;
  int local_a8;
  int local_a4;
  int j;
  int J_range;
  int i;
  int I_range;
  PointsType temp;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_50 [16];
  double local_40;
  double local_38;
  double local_30;
  double t_;
  int *derivative_order_local;
  double *t_local;
  Bezier<3,_2> *this_local;
  
  local_38 = 0.0;
  local_40 = 1.0;
  t_ = in_RCX;
  derivative_order_local = derivative_order;
  t_local = t;
  this_local = this;
  pdVar2 = std::clamp<double>((double *)derivative_order,&local_38,&local_40);
  local_30 = *pdVar2;
  if (*(int *)t_ < 4) {
    Eigen::Matrix<double,_2,_4,_0,_2,_4>::Matrix
              ((Matrix<double,_2,_4,_0,_2,_4> *)&i,
               (Matrix<double,_2,_4,_0,_2,_4> *)(t + (long)*(int *)t_ * 8 + 2));
    J_range = 3 - *(int *)t_;
    for (j = 0; j < J_range; j = j + 1) {
      local_a4 = J_range - j;
      for (local_a8 = 0; local_a8 < local_a4; local_a8 = local_a8 + 1) {
        local_1b0 = 1.0 - local_30;
        Eigen::DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::col
                  (&local_1e0,(DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)&i,(long)local_a8)
        ;
        Eigen::operator*(&local_1a8,&local_1b0,(StorageBaseType *)&local_1e0);
        Eigen::DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::col
                  (&local_260,(DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)&i,
                   (long)(local_a8 + 1));
        Eigen::operator*(&local_230,&local_30,(StorageBaseType *)&local_260);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Block<Eigen::Matrix<double,2,4,0,2,4>,2,1,true>const>>
        ::operator+(&local_158,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Block<Eigen::Matrix<double,2,4,0,2,4>,2,1,true>const>>
                     *)&local_1a8,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>_>_>
                     *)&local_230);
        Eigen::DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::col
                  (&local_290,(DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)&i,(long)local_a8)
        ;
        Eigen::Block<Eigen::Matrix<double,2,4,0,2,4>,2,1,true>::operator=
                  ((Block<Eigen::Matrix<double,2,4,0,2,4>,2,1,true> *)&local_290,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>_>_>_>
                    *)&local_158);
      }
    }
    iVar1 = *(int *)t_;
    Eigen::DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::col
              (&local_310,(DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)&i,0);
    Eigen::operator*(&local_2e0,(int *)((long)t + (long)iVar1 * 4 + 0x110),
                     (StorageBaseType *)&local_310);
    Eigen::Matrix<double,2,1,0,2,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Block<Eigen::Matrix<double,2,4,0,2,4>,2,1,true>const>>
              ((Matrix<double,2,1,0,2,1> *)this,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>_>_>
                *)&local_2e0);
    dVar3 = extraout_XMM0_Qa_00;
  }
  else {
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
    Eigen::Matrix<double,2,1,0,2,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
              ((Matrix<double,2,1,0,2,1> *)this,local_50);
    dVar3 = extraout_XMM0_Qa;
  }
  PVar4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       in_XMM1_Qa;
  PVar4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       dVar3;
  return (PointType)
         PVar4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
}

Assistant:

auto at(const double& t, const int& derivative_order = 0) const -> PointType override {
    double t_ = std::clamp(t, 0.0, 1.0);

    if (derivative_order > N) {
      return PointType::Zero();
    }

    /// De Casteljau’s Algorithm ///
    PointsType temp = derivative_precal_points_[derivative_order];

    int I_range = N - derivative_order;
    for (int i = 0; i < I_range; ++i) {
      int J_range = I_range - i;
      for (int j = 0; j < J_range; ++j) {
        {
          temp.col(j) = (1.0 - t_) * temp.col(j) + t_ * temp.col(j + 1);
        }
      }
    }
    return derivative_precal_prefix_[derivative_order] * temp.col(0);
  }